

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::GenerateGraphViz(cmake *this,string *fileName)

{
  cmGlobalGenerator *globalGenerator;
  string *psVar1;
  cmAlphaNum local_540;
  cmAlphaNum local_510;
  undefined1 local_4e0 [8];
  string fallbackSettingsFile;
  cmAlphaNum local_480;
  undefined1 local_450 [8];
  string settingsFile;
  cmGraphVizWriter gvWriter;
  string *fileName_local;
  cmake *this_local;
  
  globalGenerator = GetGlobalGenerator(this);
  cmGraphVizWriter::cmGraphVizWriter
            ((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8),fileName,globalGenerator);
  psVar1 = GetHomeOutputDirectory_abi_cxx11_(this);
  cmAlphaNum::cmAlphaNum(&local_480,psVar1);
  cmAlphaNum::cmAlphaNum
            ((cmAlphaNum *)((long)&fallbackSettingsFile.field_2 + 8),"/CMakeGraphVizOptions.cmake");
  cmStrCat<>((string *)local_450,&local_480,(cmAlphaNum *)((long)&fallbackSettingsFile.field_2 + 8))
  ;
  psVar1 = GetHomeDirectory_abi_cxx11_(this);
  cmAlphaNum::cmAlphaNum(&local_510,psVar1);
  cmAlphaNum::cmAlphaNum(&local_540,"/CMakeGraphVizOptions.cmake");
  cmStrCat<>((string *)local_4e0,&local_510,&local_540);
  cmGraphVizWriter::ReadSettings
            ((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8),(string *)local_450,
             (string *)local_4e0);
  cmGraphVizWriter::Write((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8));
  std::__cxx11::string::~string((string *)local_4e0);
  std::__cxx11::string::~string((string *)local_450);
  cmGraphVizWriter::~cmGraphVizWriter((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8));
  return;
}

Assistant:

void cmake::GenerateGraphViz(const std::string& fileName) const
{
#ifndef CMAKE_BOOTSTRAP
  cmGraphVizWriter gvWriter(fileName, this->GetGlobalGenerator());

  std::string settingsFile =
    cmStrCat(this->GetHomeOutputDirectory(), "/CMakeGraphVizOptions.cmake");
  std::string fallbackSettingsFile =
    cmStrCat(this->GetHomeDirectory(), "/CMakeGraphVizOptions.cmake");

  gvWriter.ReadSettings(settingsFile, fallbackSettingsFile);

  gvWriter.Write();

#endif
}